

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<capnp::schema::Node::SourceInfo::Reader>::dispose
          (Array<capnp::schema::Node::SourceInfo::Reader> *this)

{
  Reader *pRVar1;
  size_t sVar2;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Reader *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Reader *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)(this->disposer,pRVar1,0x30,sVar2,sVar2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }